

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O1

Gia_Man_t * Gia_ManReduceEquiv(Gia_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  int iVar8;
  int *pCi2Lit;
  void *__s;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  size_t __size;
  int iVar16;
  long lVar17;
  size_t __size_00;
  
  iVar16 = p->nRegs;
  lVar17 = (long)iVar16;
  if (0 < lVar17) {
    pVVar5 = p->vCos;
    iVar8 = pVVar5->nSize;
    uVar10 = (ulong)(uint)(iVar8 - iVar16);
    lVar11 = lVar17;
    do {
      if (((int)uVar10 < 0) || (iVar8 <= (int)uVar10)) goto LAB_0021e77a;
      iVar7 = pVVar5->pArray[uVar10];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0021e75b;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar7;
      pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value = 0;
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  if (iVar16 < 1) {
    __size = 8;
  }
  else {
    pVVar5 = p->vCos;
    iVar8 = pVVar5->nSize;
    uVar10 = (ulong)(uint)(iVar8 - iVar16);
    iVar7 = 1;
    do {
      if (((int)uVar10 < 0) || (iVar8 <= (int)uVar10)) goto LAB_0021e77a;
      iVar2 = pVVar5->pArray[uVar10];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0021e75b;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      uVar13 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
      if (pGVar1[-uVar13].Value == 0) {
        pGVar1[-uVar13].Value = iVar7 * 2;
        iVar7 = iVar7 + 1;
      }
      uVar10 = uVar10 + 1;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
    __size = (long)(iVar7 * 2) << 2;
  }
  pVVar5 = p->vCis;
  __size_00 = (long)pVVar5->nSize << 2;
  pCi2Lit = (int *)malloc(__size_00);
  memset(pCi2Lit,0xff,__size_00);
  __s = malloc(__size);
  memset(__s,0xff,__size);
  uVar15 = 0;
  if (0 < iVar16) {
    pVVar6 = p->vCos;
    iVar16 = -iVar16;
    iVar8 = 0;
LAB_0021e618:
    iVar7 = pVVar6->nSize;
    uVar9 = iVar16 + iVar7;
    if (((int)uVar9 < 0) || (iVar7 <= (int)uVar9)) {
LAB_0021e77a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar9 = pVVar6->pArray[uVar9];
    if (((long)(int)uVar9 < 0) || (iVar7 = p->nObjs, iVar7 <= (int)uVar9)) {
LAB_0021e75b:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (p->pObjs != (Gia_Obj_t *)0x0) {
      uVar12 = iVar16 + pVVar5->nSize;
      if (((int)uVar12 < 0) || (pVVar5->nSize <= (int)uVar12)) goto LAB_0021e77a;
      iVar2 = pVVar5->pArray[uVar12];
      if ((iVar2 < 0) || (iVar7 <= iVar2)) goto LAB_0021e75b;
      pGVar1 = p->pObjs + (int)uVar9;
      uVar10 = *(ulong *)pGVar1;
      uVar14 = (uint)uVar10;
      uVar3 = pGVar1[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar10 = uVar10 >> 0x1d;
      if ((uVar9 == (uVar14 & 0x1fffffff)) && ((uVar10 & 1) == 0)) {
        pCi2Lit[uVar12] = 0;
        iVar8 = iVar8 + 1;
      }
      else {
        uVar10 = (ulong)((uint)uVar10 & 1 ^ uVar3);
        iVar4 = *(int *)((long)__s + uVar10 * 4);
        if (iVar4 == -1) {
          if (iVar7 <= iVar2) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                          ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (iVar2 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          *(int *)((long)__s + uVar10 * 4) = iVar2 * 2;
        }
        else {
          pCi2Lit[uVar12] = iVar4;
          uVar15 = uVar15 + 1;
        }
      }
      iVar16 = iVar16 + 1;
      if (iVar16 != 0) goto LAB_0021e618;
    }
    uVar15 = (uint)(iVar8 != 0 || uVar15 != 0);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if ((char)uVar15 != '\0') {
    p = Gia_ManDupDfsCiMap(p,pCi2Lit,(Vec_Int_t *)0x0);
  }
  if (pCi2Lit != (int *)0x0) {
    free(pCi2Lit);
  }
  return p;
}

Assistant:

Gia_Man_t * Gia_ManReduceEquiv( Gia_Man_t * p, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObjRi, * pObjRo;
    unsigned * pCi2Lit, * pMaps;
    int i, iLit, nFanins = 1, Counter0 = 0, Counter = 0;
    Gia_ManForEachRi( p, pObjRi, i )
        Gia_ObjFanin0(pObjRi)->Value = 0;
    Gia_ManForEachRi( p, pObjRi, i )
        if ( Gia_ObjFanin0(pObjRi)->Value == 0 )
            Gia_ObjFanin0(pObjRi)->Value = 2*nFanins++;
    pCi2Lit = ABC_FALLOC( unsigned, Gia_ManCiNum(p) );
    pMaps   = ABC_FALLOC( unsigned, 2 * nFanins );
    Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
    {
        iLit = Gia_ObjFanin0Copy( pObjRi );
        if ( Gia_ObjFaninId0p(p, pObjRi) == 0 && Gia_ObjFaninC0(pObjRi) == 0 ) // const 0 
            pCi2Lit[Gia_ManPiNum(p)+i] = 0, Counter0++;
        else if ( ~pMaps[iLit] ) // in this case, ID(pObj) > ID(pRepr) 
            pCi2Lit[Gia_ManPiNum(p)+i] = pMaps[iLit], Counter++; 
        else
            pMaps[iLit] = Abc_Var2Lit( Gia_ObjId(p, pObjRo), 0 );
    }
/*
    Gia_ManForEachCi( p, pObjRo, i )
    {
        if ( ~pCi2Lit[i] )
        {
            Gia_Obj_t * pObj0 = Gia_ObjRoToRi(p, pObjRo);
            Gia_Obj_t * pObj1 = Gia_ObjRoToRi(p, Gia_ManObj(p, pCi2Lit[i]));
            Gia_Obj_t * pFan0 = Gia_ObjChild0( p, Gia_ObjRoToRi(p, pObjRo) );
            Gia_Obj_t * pFan1 = Gia_ObjChild0( p, Gia_ObjRoToRi(p, Gia_ManObj(p, pCi2Lit[i])) );
            assert( pFan0 == pFan1 );
        }
    }
*/
//    if ( fVerbose )
//        printf( "ReduceEquiv detected %d constant regs and %d equivalent regs.\n", Counter0, Counter );
    ABC_FREE( pMaps );
    if ( Counter0 || Counter )
        pNew = Gia_ManDupDfsCiMap( p, (int *)pCi2Lit, NULL );
    else
        pNew = p;
    ABC_FREE( pCi2Lit );
    return pNew;
}